

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON_bool
add_item_to_object(cJSON *object,char *string,cJSON *item,internal_hooks *hooks,
                  cJSON_bool constant_key)

{
  uint local_44;
  uchar *puStack_40;
  int new_type;
  char *new_key;
  cJSON_bool constant_key_local;
  internal_hooks *hooks_local;
  cJSON *item_local;
  char *string_local;
  cJSON *object_local;
  
  if ((((object == (cJSON *)0x0) || (string == (char *)0x0)) || (item == (cJSON *)0x0)) ||
     (object == item)) {
    object_local._4_4_ = 0;
  }
  else {
    if (constant_key == 0) {
      puStack_40 = cJSON_strdup((uchar *)string,hooks);
      if (puStack_40 == (uchar *)0x0) {
        return 0;
      }
      local_44 = item->type & 0xfffffdff;
    }
    else {
      puStack_40 = (uchar *)cast_away_const(string);
      local_44 = item->type | 0x200;
    }
    if (((item->type & 0x200U) == 0) && (item->string != (char *)0x0)) {
      (*hooks->deallocate)(item->string);
    }
    item->string = (char *)puStack_40;
    item->type = local_44;
    object_local._4_4_ = add_item_to_array(object,item);
  }
  return object_local._4_4_;
}

Assistant:

static cJSON_bool add_item_to_object(cJSON * const object, const char * const string, cJSON * const item, const internal_hooks * const hooks, const cJSON_bool constant_key)
{
    char *new_key = NULL;
    int new_type = cJSON_Invalid;

    if ((object == NULL) || (string == NULL) || (item == NULL) || (object == item))
    {
        return false;
    }

    if (constant_key)
    {
        new_key = (char*)cast_away_const(string);
        new_type = item->type | cJSON_StringIsConst;
    }
    else
    {
        new_key = (char*)cJSON_strdup((const unsigned char*)string, hooks);
        if (new_key == NULL)
        {
            return false;
        }

        new_type = item->type & ~cJSON_StringIsConst;
    }

    if (!(item->type & cJSON_StringIsConst) && (item->string != NULL))
    {
        hooks->deallocate(item->string);
    }

    item->string = new_key;
    item->type = new_type;

    return add_item_to_array(object, item);
}